

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::readOptions(Highs *this,string *filename)

{
  HighsLoadOptionsStatus HVar1;
  long lVar2;
  string *in_RSI;
  long in_RDI;
  HighsLogOptions report_log_options;
  string *in_stack_000002c8;
  HighsOptions *in_stack_000002d0;
  HighsLogOptions *in_stack_000002d8;
  HighsLogOptions *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string local_98 [112];
  Highs *in_stack_ffffffffffffffd8;
  HighsStatus local_4;
  
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                 "Empty file name so not reading options\n");
    local_4 = kWarning;
  }
  else {
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    std::__cxx11::string::string(local_98,in_RSI);
    HVar1 = loadOptionsFromFile(in_stack_000002d8,in_stack_000002d0,in_stack_000002c8);
    std::__cxx11::string::~string(local_98);
    if ((HVar1 == kError) || (HVar1 == kEmpty)) {
      local_4 = kError;
    }
    else {
      local_4 = optionChangeAction(in_stack_ffffffffffffffd8);
    }
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x483e5d);
  }
  return local_4;
}

Assistant:

HighsStatus Highs::readOptions(const std::string& filename) {
  if (filename.size() <= 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Empty file name so not reading options\n");
    return HighsStatus::kWarning;
  }
  HighsLogOptions report_log_options = options_.log_options;
  switch (loadOptionsFromFile(report_log_options, options_, filename)) {
    case HighsLoadOptionsStatus::kError:
    case HighsLoadOptionsStatus::kEmpty:
      return HighsStatus::kError;
    default:
      break;
  }
  return optionChangeAction();
}